

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolveMember
          (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  long lVar1;
  iterator iVar2;
  iterator iVar3;
  StringPtr name_local;
  undefined1 local_80 [104];
  
  name_local.content.size_ = name.content.size_;
  name_local.content.ptr = name.content.ptr;
  if (this->isBuiltin != true) {
    getContent((Node *)local_80,(State)this);
    lVar1 = CONCAT44(local_80._4_4_,local_80._0_4_);
    if (lVar1 != 0) {
      iVar2 = std::
              _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
              ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
                      *)(lVar1 + 8),&name_local);
      if (iVar2._M_node != (_Base_ptr)(lVar1 + 0x10)) {
        local_80._40_8_ = iVar2._M_node[1]._M_right;
        local_80._8_8_ = ((_Base_ptr)(local_80._40_8_ + 0x40))->_M_parent;
        local_80._16_4_ = *(undefined4 *)&((_Base_ptr)(local_80._40_8_ + 0x60))->field_0x4;
        local_80._24_8_ = this->id;
        local_80._32_2_ = (undefined2)((_Base_ptr)(local_80._40_8_ + 0x60))->_M_color;
        local_80[0x30] = '\0';
        local_80._0_4_ = 1;
        kj::_::
        NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
        ::NullableValue(&__return_storage_ptr__->ptr,
                        (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                         *)local_80);
        return __return_storage_ptr__;
      }
      iVar3 = std::
              _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
              ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
                      *)(lVar1 + 0x58),&name_local);
      if (iVar3._M_node != (_Base_ptr)(lVar1 + 0x60)) {
        Alias::compile(__return_storage_ptr__,(Alias *)iVar3._M_node[1]._M_right);
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult>
Compiler::Node::resolveMember(kj::StringPtr name) {
  if (isBuiltin) return kj::none;

  KJ_IF_SOME(content, getContent(Content::EXPANDED)) {
    {
      auto iter = content.nestedNodes.find(name);
      if (iter != content.nestedNodes.end()) {
        Node* node = iter->second;
        ResolveResult result;
        result.init<ResolvedDecl>(ResolvedDecl {
            node->id, node->genericParamCount, id, node->kind, node, kj::none });
        return result;
      }
    }
    {
      auto iter = content.aliases.find(name);
      if (iter != content.aliases.end()) {
        return iter->second->compile();
      }
    }
  }
  return kj::none;
}